

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Lms_ManPrepare(Lms_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Wrd_t *pVVar4;
  Vec_Str_t *pVVar5;
  int local_14;
  int Entry;
  int i;
  Lms_Man_t *p_local;
  
  if (p->fLibConstr != 0) {
    __assert_fail("!p->fLibConstr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x184,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (p->vTruthPo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTruthPo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x185,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  iVar1 = Vec_MemEntryNum(p->vTtMem);
  pVVar3 = Vec_IntStartFull(iVar1 + 1);
  p->vTruthPo = pVVar3;
  iVar1 = Vec_IntFindMin(p->vTruthIds);
  if (iVar1 < 0) {
    __assert_fail("Vec_IntFindMin(p->vTruthIds) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x187,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  iVar1 = Vec_IntFindMax(p->vTruthIds);
  iVar2 = Vec_MemEntryNum(p->vTtMem);
  if (iVar2 <= iVar1) {
    __assert_fail("Vec_IntFindMax(p->vTruthIds) < Vec_MemEntryNum(p->vTtMem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x188,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  for (local_14 = 0; iVar1 = Vec_IntSize(p->vTruthIds), local_14 < iVar1; local_14 = local_14 + 1) {
    iVar1 = Vec_IntEntry(p->vTruthIds,local_14);
    iVar2 = Vec_IntEntry(p->vTruthPo,iVar1);
    if (iVar2 == -1) {
      Vec_IntWriteEntry(p->vTruthPo,iVar1,local_14);
    }
  }
  pVVar3 = p->vTruthPo;
  iVar1 = Vec_MemEntryNum(p->vTtMem);
  iVar2 = Gia_ManCoNum(p->pGia);
  Vec_IntWriteEntry(pVVar3,iVar1,iVar2);
  if (p->vDelays != (Vec_Wrd_t *)0x0) {
    __assert_fail("p->vDelays == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x18e,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (p->vAreas != (Vec_Str_t *)0x0) {
    __assert_fail("p->vAreas == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,399,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (p->vFreqs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vFreqs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,400,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  pVVar4 = Lms_GiaDelays(p->pGia);
  p->vDelays = pVVar4;
  pVVar5 = Lms_GiaAreas(p->pGia);
  p->vAreas = pVVar5;
  iVar1 = Gia_ManCoNum(p->pGia);
  pVVar3 = Vec_IntStart(iVar1);
  p->vFreqs = pVVar3;
  return;
}

Assistant:

void Lms_ManPrepare( Lms_Man_t * p )
{
    // compute the first PO for each semi-canonical form
    int i, Entry;
    assert( !p->fLibConstr );
    assert( p->vTruthPo == NULL );
    p->vTruthPo = Vec_IntStartFull( Vec_MemEntryNum(p->vTtMem)+1 );
    assert( Vec_IntFindMin(p->vTruthIds) >= 0 );
    assert( Vec_IntFindMax(p->vTruthIds) < Vec_MemEntryNum(p->vTtMem) );
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
        if ( Vec_IntEntry(p->vTruthPo, Entry) == -1 )
            Vec_IntWriteEntry( p->vTruthPo, Entry, i );
    Vec_IntWriteEntry( p->vTruthPo, Vec_MemEntryNum(p->vTtMem), Gia_ManCoNum(p->pGia) );
    // compute delay/area and init frequency
    assert( p->vDelays == NULL );
    assert( p->vAreas == NULL );
    assert( p->vFreqs == NULL );
    p->vDelays = Lms_GiaDelays( p->pGia );
    p->vAreas  = Lms_GiaAreas( p->pGia );
    p->vFreqs  = Vec_IntStart( Gia_ManCoNum(p->pGia) );
}